

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

string * __thiscall
helics::DelayFilterOperation::getString_abi_cxx11_(DelayFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string *in_RDI;
  FilterOperations *in_stack_ffffffffffffff88;
  string *__val;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  __val = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RSI,(char *)in_RDI);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    std::atomic<TimeRepresentation<count_time<9,_long>_>_>::load
              ((atomic<TimeRepresentation<count_time<9,_long>_>_> *)&in_RSI->_M_str,seq_cst);
    TimeRepresentation::operator_cast_to_double
              ((TimeRepresentation<count_time<9,_long>_> *)0x2d78b5);
    std::__cxx11::to_string((double)__val);
  }
  else {
    sVar1._M_str = (char *)__val;
    sVar1._M_len = (size_t)in_RDI;
    FilterOperations::getString_abi_cxx11_(in_stack_ffffffffffffff88,sVar1);
  }
  return __val;
}

Assistant:

std::string DelayFilterOperation::getString(std::string_view property)
{
    if (property == "delay") {
        return std::to_string(delay.load());
    }
    return FilterOperations::getString(property);
}